

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O3

int compression_init_encoder_lzma
              (archive *a,la_zstream_conflict *lastrm,int level,uint64_t filter_id)

{
  char cVar1;
  int iVar2;
  void *__ptr;
  uint8_t *puVar3;
  char *fmt;
  ulong __size;
  lzma_options_lzma lzma_opt;
  undefined1 local_a0 [112];
  
  if (lastrm->valid != 0) {
    lastrm->prop_size = 0;
    free(lastrm->props);
    lastrm->props = (uint8_t *)0x0;
    (*lastrm->end)(a,lastrm);
  }
  __ptr = calloc(1,0xa8);
  if (__ptr == (void *)0x0) {
    fmt = "Can\'t allocate memory for lzma stream";
  }
  else {
    iVar2 = 9;
    if (level < 9) {
      iVar2 = level;
    }
    cVar1 = lzma_lzma_preset(local_a0,iVar2);
    if (cVar1 == '\0') {
      *(uint64_t *)((long)__ptr + 0x88) = filter_id;
      *(undefined1 **)((long)__ptr + 0x90) = local_a0;
      *(undefined8 *)((long)__ptr + 0x98) = 0xffffffffffffffff;
      iVar2 = lzma_properties_size(&lastrm->prop_size);
      if (iVar2 == 0) {
        __size = (ulong)lastrm->prop_size;
        if (__size != 0) {
          puVar3 = (uint8_t *)malloc(__size);
          lastrm->props = puVar3;
          if (puVar3 == (uint8_t *)0x0) {
            free(__ptr);
            lastrm->real_stream = (void *)0x0;
            fmt = "Cannot allocate memory";
            goto LAB_00172307;
          }
          iVar2 = lzma_properties_encode((long)__ptr + 0x88);
          if (iVar2 != 0) {
            free(__ptr);
            lastrm->real_stream = (void *)0x0;
            fmt = "lzma_properties_encode failed";
            goto LAB_00172377;
          }
        }
        memset(__ptr,0,0x88);
        iVar2 = lzma_raw_encoder(__ptr,(long)__ptr + 0x88);
        if (iVar2 == 5) {
          free(__ptr);
          lastrm->real_stream = (void *)0x0;
          fmt = "Internal error initializing compression library: Cannot allocate memory";
          goto LAB_00172307;
        }
        if (iVar2 == 0) {
          lastrm->real_stream = __ptr;
          lastrm->valid = 1;
          lastrm->code = compression_code_lzma;
          lastrm->end = compression_end_lzma;
          return 0;
        }
        free(__ptr);
        lastrm->real_stream = (void *)0x0;
        fmt = "Internal error initializing compression library: It\'s a bug in liblzma";
      }
      else {
        free(__ptr);
        lastrm->real_stream = (void *)0x0;
        fmt = "lzma_properties_size failed";
      }
LAB_00172377:
      iVar2 = -1;
      goto LAB_0017230f;
    }
    free(__ptr);
    lastrm->real_stream = (void *)0x0;
    fmt = "Internal error initializing compression library";
  }
LAB_00172307:
  iVar2 = 0xc;
LAB_0017230f:
  archive_set_error(a,iVar2,fmt);
  return -0x1e;
}

Assistant:

static int
compression_init_encoder_lzma(struct archive *a,
    struct la_zstream *lastrm, int level, uint64_t filter_id)
{
	static const lzma_stream lzma_init_data = LZMA_STREAM_INIT;
	lzma_stream *strm;
	lzma_filter *lzmafilters;
	lzma_options_lzma lzma_opt;
	int r;

	if (lastrm->valid)
		compression_end(a, lastrm);
	strm = calloc(1, sizeof(*strm) + sizeof(*lzmafilters) * 2);
	if (strm == NULL) {
		archive_set_error(a, ENOMEM,
		    "Can't allocate memory for lzma stream");
		return (ARCHIVE_FATAL);
	}
	lzmafilters = (lzma_filter *)(strm+1);
	if (level > 9)
		level = 9;
	if (lzma_lzma_preset(&lzma_opt, level)) {
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ENOMEM,
		    "Internal error initializing compression library");
		return (ARCHIVE_FATAL);
	}
	lzmafilters[0].id = filter_id;
	lzmafilters[0].options = &lzma_opt;
	lzmafilters[1].id = LZMA_VLI_UNKNOWN;/* Terminate */

	r = lzma_properties_size(&(lastrm->prop_size), lzmafilters);
	if (r != LZMA_OK) {
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "lzma_properties_size failed");
		return (ARCHIVE_FATAL);
	}
	if (lastrm->prop_size) {
		lastrm->props = malloc(lastrm->prop_size);
		if (lastrm->props == NULL) {
			free(strm);
			lastrm->real_stream = NULL;
			archive_set_error(a, ENOMEM,
			    "Cannot allocate memory");
			return (ARCHIVE_FATAL);
		}
		r = lzma_properties_encode(lzmafilters,  lastrm->props);
		if (r != LZMA_OK) {
			free(strm);
			lastrm->real_stream = NULL;
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "lzma_properties_encode failed");
			return (ARCHIVE_FATAL);
		}
	}

	*strm = lzma_init_data;
	r = lzma_raw_encoder(strm, lzmafilters);
	switch (r) {
	case LZMA_OK:
		lastrm->real_stream = strm;
		lastrm->valid = 1;
		lastrm->code = compression_code_lzma;
		lastrm->end = compression_end_lzma;
		r = ARCHIVE_OK;
		break;
	case LZMA_MEM_ERROR:
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ENOMEM,
		    "Internal error initializing compression library: "
		    "Cannot allocate memory");
		r =  ARCHIVE_FATAL;
		break;
        default:
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library: "
		    "It's a bug in liblzma");
		r =  ARCHIVE_FATAL;
		break;
	}
	return (r);
}